

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathBox.h
# Opt level: O0

void __thiscall
Imath_3_2::Box<Imath_3_2::Vec2<int>_>::extendBy
          (Box<Imath_3_2::Vec2<int>_> *this,Box<Imath_3_2::Vec2<int>_> *box)

{
  int *piVar1;
  int *in_RSI;
  int *in_RDI;
  
  piVar1 = std::min<int>(in_RDI,in_RSI);
  *in_RDI = *piVar1;
  piVar1 = std::max<int>(in_RDI + 2,in_RSI + 2);
  in_RDI[2] = *piVar1;
  piVar1 = std::min<int>(in_RDI + 1,in_RSI + 1);
  in_RDI[1] = *piVar1;
  piVar1 = std::max<int>(in_RDI + 3,in_RSI + 3);
  in_RDI[3] = *piVar1;
  return;
}

Assistant:

IMATH_HOSTDEVICE inline void
Box<Vec2<T>>::extendBy (const Box<Vec2<T>>& box) IMATH_NOEXCEPT
{
    min.x = std::min (min.x, box.min.x);
    max.x = std::max (max.x, box.max.x);
    min.y = std::min (min.y, box.min.y);
    max.y = std::max (max.y, box.max.y);
}